

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

bool baryonyx::itm::init_x<baryonyx::itm::minimize_tag,double>(double cost,int value_if_cost_0)

{
  int value_if_cost_0_local;
  double cost_local;
  
  if (0.0 <= cost) {
    if ((cost != 0.0) || (NAN(cost))) {
      cost_local._7_1_ = false;
    }
    else {
      cost_local._7_1_ = value_if_cost_0 != 0;
    }
  }
  else {
    cost_local._7_1_ = true;
  }
  return cost_local._7_1_;
}

Assistant:

inline bool
init_x(Float cost, int value_if_cost_0) noexcept
{
    if constexpr (std::is_same_v<Mode, minimize_tag>) {
        if (cost < 0)
            return true;

        if (cost == 0)
            return value_if_cost_0;
    } else {
        if (cost > 0)
            return true;

        if (cost == 0)
            return value_if_cost_0;
    }

    return false;
}